

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O3

uint32_t miniply::triangulate_polygon(uint32_t n,float *pos,uint32_t numVerts,int *indices,int *dst)

{
  Vec2 VVar1;
  uint32_t i;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *prev_00;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint32_t uVar8;
  uint32_t idx;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> next;
  vector<unsigned_int,_std::allocator<unsigned_int>_> prev;
  vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> points2D;
  allocator_type local_f9;
  float local_f8;
  value_type_conflict2 local_f4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> local_b0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  uVar8 = 0;
  if (2 < n) {
    if (n == 3) {
      *dst = *indices;
      dst[1] = indices[1];
      dst[2] = indices[2];
    }
    else {
      if (n == 4) {
        *dst = *indices;
        dst[1] = indices[1];
        dst[2] = indices[3];
        dst[3] = indices[2];
        dst[4] = indices[3];
        dst[5] = indices[1];
        return 2;
      }
      uVar3 = (ulong)n;
      uVar4 = 0;
      do {
        if (indices[uVar4] < 0) {
          return 0;
        }
        if (numVerts <= (uint)indices[uVar4]) {
          return 0;
        }
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
      local_d8 = *(undefined8 *)(pos + (long)*indices * 3);
      fStack_84 = (float)((ulong)local_d8 >> 0x20);
      local_f8 = pos[(long)*indices * 3 + 2];
      fVar11 = (float)*(undefined8 *)(pos + (long)indices[1] * 3) - (float)local_d8;
      fStack_94 = (float)((ulong)*(undefined8 *)(pos + (long)indices[1] * 3) >> 0x20) - fStack_84;
      uStack_d0 = 0;
      fVar14 = pos[(long)indices[1] * 3 + 2] - local_f8;
      fVar12 = SQRT(fVar14 * fVar14 + fVar11 * fVar11 + fStack_94 * fStack_94);
      fVar9 = (float)*(undefined8 *)(pos + (long)indices[n - 1] * 3) - (float)local_d8;
      fStack_84 = (float)((ulong)*(undefined8 *)(pos + (long)indices[n - 1] * 3) >> 0x20) -
                  fStack_84;
      fVar10 = pos[(long)indices[n - 1] * 3 + 2] - local_f8;
      fVar13 = SQRT(fVar10 * fVar10 + fVar9 * fVar9 + fStack_84 * fStack_84);
      fVar11 = fVar11 / fVar12;
      local_68 = fStack_94 / fVar12;
      fVar14 = fVar14 / fVar12;
      fVar12 = local_68 * (fVar10 / fVar13) - fVar14 * (fStack_84 / fVar13);
      fVar10 = fVar14 * (fVar9 / fVar13) - (fVar10 / fVar13) * fVar11;
      local_58 = CONCAT44(fStack_94,fVar11);
      uStack_50 = 0;
      fVar15 = (fStack_84 / fVar13) * fVar11 - (fVar9 / fVar13) * local_68;
      fVar9 = SQRT(fVar15 * fVar15 + fVar12 * fVar12 + fVar10 * fVar10);
      local_48 = ZEXT416((uint)fVar14);
      fVar13 = (fVar10 / fVar9) * fVar14 - (fVar15 / fVar9) * local_68;
      local_88 = (fVar15 / fVar9) * fVar11 - fVar14 * (fVar12 / fVar9);
      local_98 = (fVar12 / fVar9) * local_68 - fVar11 * (fVar10 / fVar9);
      fVar9 = SQRT(local_98 * local_98 + fVar13 * fVar13 + local_88 * local_88);
      local_78 = ZEXT416((uint)(fVar13 / fVar9));
      local_88 = local_88 / fVar9;
      local_98 = local_98 / fVar9;
      local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      fStack_90 = fStack_94;
      fStack_8c = fStack_94;
      fStack_80 = fStack_84;
      fStack_7c = fStack_84;
      fStack_64 = fStack_94;
      fStack_60 = fStack_94;
      fStack_5c = fStack_94;
      std::vector<miniply::Vec2,_std::allocator<miniply::Vec2>_>::vector
                (&local_b0,uVar3,(value_type *)&local_f0,(allocator_type *)&local_c8);
      uVar4 = 1;
      do {
        fVar9 = (float)*(undefined8 *)(pos + (long)indices[uVar4] * 3) - (float)local_d8;
        fVar10 = (float)((ulong)*(undefined8 *)(pos + (long)indices[uVar4] * 3) >> 0x20) -
                 local_d8._4_4_;
        VVar1.y = (pos[(long)indices[uVar4] * 3 + 2] - local_f8) * local_98 +
                  fVar9 * (float)local_78._0_4_ + fVar10 * local_88;
        VVar1.x = (pos[(long)indices[uVar4] * 3 + 2] - local_f8) * (float)local_48._0_4_ +
                  fVar9 * (float)local_58 + fVar10 * local_68;
        local_b0.super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = VVar1;
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
      local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_f0,uVar3,(value_type_conflict2 *)&local_c8,(allocator_type *)&local_f4);
      local_f4 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_c8,uVar3,&local_f4,&local_f9);
      prev_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                CONCAT44(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_4_);
      uVar2 = 0;
      uVar4 = (ulong)(n - 1);
      do {
        uVar7 = uVar2 & 0xffffffff;
        *(int *)((long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar4 * 4) = (int)uVar2;
        *(int *)((long)&(prev_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start + uVar2 * 4) = (int)uVar4;
        uVar2 = uVar2 + 1;
        uVar4 = uVar7;
      } while (uVar3 != uVar2);
      uVar4 = 0;
      if (n != 3) {
        do {
          idx = (uint32_t)uVar4;
          fVar9 = angle_at_vert(idx,(vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *)
                                    local_b0.
                                    super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>
                                    ._M_impl.super__Vector_impl_data._M_start,prev_00,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                local_f0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          uVar5 = *(uint *)((long)local_f0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar4 * 4);
          uVar3 = uVar4;
          uVar2 = uVar4;
          uVar8 = idx;
          uVar6 = idx;
          if (uVar5 != idx) {
            do {
              local_d8 = CONCAT44(local_d8._4_4_,fVar9);
              fVar9 = angle_at_vert(uVar5,(vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *)
                                          local_b0.
                                          super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    CONCAT44(local_c8.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             local_c8.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_),
                                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    local_f0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
              if (fVar9 < (float)local_d8) {
                uVar2 = (ulong)uVar5;
              }
              if ((float)local_d8 <= fVar9) {
                fVar9 = (float)local_d8;
              }
              uVar5 = *(uint *)((long)local_f0.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (ulong)uVar5 * 4);
            } while (uVar5 != idx);
            uVar6 = *(uint *)((long)local_f0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + uVar2 * 4);
            uVar3 = (ulong)uVar6;
            uVar8 = (uint32_t)uVar2;
          }
          prev_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(local_c8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             local_c8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._0_4_);
          uVar5 = *(uint *)((long)&(prev_00->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start + uVar2 * 4);
          *dst = indices[uVar2];
          dst[1] = indices[uVar3];
          dst[2] = indices[uVar5];
          dst = dst + 3;
          if (uVar8 == idx) {
            uVar4 = (ulong)uVar6;
          }
          *(uint *)((long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start + (ulong)uVar5 * 4) = uVar6;
          *(uint *)((long)&(prev_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar3 * 4) = uVar5;
          n = n - 1;
        } while (3 < n);
      }
      *dst = indices[uVar4];
      dst[1] = indices[*(uint *)((long)local_f0.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar4 * 4)];
      dst[2] = indices[*(uint *)((long)&(prev_00->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar4 * 4)];
      operator_delete(prev_00);
      if ((value_type)
          local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (value_type)0x0) {
        operator_delete(local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b0.super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    uVar8 = 1;
  }
  return uVar8;
}

Assistant:

uint32_t triangulate_polygon(uint32_t n, const float pos[], uint32_t numVerts, const int indices[], int dst[])
  {
    if (n < 3) {
      return 0;
    }
    else if (n == 3) {
      dst[0] = indices[0];
      dst[1] = indices[1];
      dst[2] = indices[2];
      return 1;
    }
    else if (n == 4) {
      dst[0] = indices[0];
      dst[1] = indices[1];
      dst[2] = indices[3];

      dst[3] = indices[2];
      dst[4] = indices[3];
      dst[5] = indices[1];
      return 2;
    }

    // Check that all indices for this face are in the valid range before we
    // try to dereference them.
    for (uint32_t i = 0; i < n; i++) {
      if (indices[i] < 0 || uint32_t(indices[i]) >= numVerts) {
        return 0;
      }
    }

    const Vec3* vpos = reinterpret_cast<const Vec3*>(pos);

    // Calculate the geometric normal of the face
    Vec3 origin = vpos[indices[0]];
    Vec3 faceU = normalize(vpos[indices[1]] - origin);
    Vec3 faceNormal = normalize(cross(faceU, normalize(vpos[indices[n - 1]] - origin)));
    Vec3 faceV = normalize(cross(faceNormal, faceU));

    // Project the faces points onto the plane perpendicular to the normal.
    std::vector<Vec2> points2D(n, Vec2{0.0f, 0.0f});
    for (uint32_t i = 1; i < n; i++) {
      Vec3 p = vpos[indices[i]] - origin;
      points2D[i] = Vec2{dot(p, faceU), dot(p, faceV)};
    }

    std::vector<uint32_t> next(n, 0u);
    std::vector<uint32_t> prev(n, 0u);
    uint32_t first = 0;
    for (uint32_t i = 0, j = n - 1; i < n; i++) {
      next[j] = i;
      prev[i] = j;
      j = i;
    }

    // Do ear clipping.
    while (n > 3) {
      // Find the (remaining) vertex with the sharpest angle.
      uint32_t bestI = first;
      float bestAngle = angle_at_vert(first, points2D, prev, next);
      for (uint32_t i = next[first]; i != first; i = next[i]) {
        float angle = angle_at_vert(i, points2D, prev, next);
        if (angle < bestAngle) {
          bestI = i;
          bestAngle = angle;
        }
      }

      // Clip the triangle at bestI.
      uint32_t nextI = next[bestI];
      uint32_t prevI = prev[bestI];

      dst[0] = indices[bestI];
      dst[1] = indices[nextI];
      dst[2] = indices[prevI];
      dst += 3;

      if (bestI == first) {
        first = nextI;
      }
      next[prevI] = nextI;
      prev[nextI] = prevI;
      --n;
    }

    // Add the final triangle.
    dst[0] = indices[first];
    dst[1] = indices[next[first]];
    dst[2] = indices[prev[first]];

    return n - 2;
  }